

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_plt_data(FILE *file,REF_INT nvar,REF_LIST zone_type,REF_LIST zone_packing,
                 REF_LIST zone_nnode,REF_LIST zone_nelem,REF_INT *length,REF_DBL **soln)

{
  uint uVar1;
  size_t sVar2;
  REF_DBL *pRVar3;
  double dVar4;
  double local_210;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_DBL ref_private_status_rwds_allowed;
  REF_DBL ref_private_status_rwds_del;
  REF_DBL ref_private_status_rwds_bd;
  REF_DBL ref_private_status_rwds_ad;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_LIST dataformats;
  double var_double;
  int local_88;
  float var_float;
  REF_INT nelem;
  REF_INT nnode;
  REF_INT packing;
  REF_INT zonetype;
  double maxval;
  double minval;
  int c2n;
  int conn;
  int sharing;
  int passive;
  REF_INT node_per;
  REF_INT elem;
  REF_INT node;
  REF_INT i;
  int dataformat;
  float zonemarker;
  REF_LIST zone_nelem_local;
  REF_LIST zone_nnode_local;
  REF_LIST zone_packing_local;
  REF_LIST zone_type_local;
  FILE *pFStack_18;
  REF_INT nvar_local;
  FILE *file_local;
  
  _ref_private_macro_code_rss = (REF_LIST)0x0;
  _dataformat = zone_nelem;
  zone_nelem_local = zone_nnode;
  zone_nnode_local = zone_packing;
  zone_packing_local = zone_type;
  zone_type_local._4_4_ = nvar;
  pFStack_18 = (FILE *)file;
  uVar1 = ref_list_create((REF_LIST *)&ref_private_macro_code_rss);
  if (uVar1 == 0) {
    uVar1 = ref_list_shift(zone_packing_local,&nnode);
    if (uVar1 == 0) {
      uVar1 = ref_list_shift(zone_nnode_local,&nelem);
      if (uVar1 == 0) {
        uVar1 = ref_list_shift(zone_nelem_local,(REF_INT *)&var_float);
        if (uVar1 == 0) {
          uVar1 = ref_list_shift(_dataformat,&local_88);
          if (uVar1 == 0) {
            switch(nnode) {
            case 1:
              sharing = 2;
              break;
            case 2:
              sharing = 3;
              break;
            case 3:
              sharing = 4;
              break;
            case 4:
              sharing = 4;
              break;
            case 5:
              sharing = 8;
              break;
            default:
              printf("zonetype = %d\n",(ulong)(uint)nnode);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x991,"ref_part_plt_data","unknown tecplot plt zonetype read");
              return 1;
            }
            *length = (REF_INT)var_float;
            sVar2 = fread(&i,4,1,pFStack_18);
            if (sVar2 == 1) {
              dVar4 = (double)(float)i;
              if (299.0 - dVar4 <= 0.0) {
                local_210 = -(299.0 - dVar4);
              }
              else {
                local_210 = 299.0 - dVar4;
              }
              if (local_210 <= 2.99e-10) {
                for (elem = 0; elem < zone_type_local._4_4_; elem = elem + 1) {
                  sVar2 = fread(&node,4,1,pFStack_18);
                  if (sVar2 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x99d,"ref_part_plt_data","dim",1,sVar2);
                    return 1;
                  }
                  uVar1 = ref_list_push(_ref_private_macro_code_rss,node);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x99e,"ref_part_plt_data",(ulong)uVar1,"save dataformat");
                    return uVar1;
                  }
                }
                sVar2 = fread(&conn,4,1,pFStack_18);
                if (sVar2 == 1) {
                  if (conn == 1) {
                    for (elem = 0; elem < zone_type_local._4_4_; elem = elem + 1) {
                      sVar2 = fread(&conn,4,1,pFStack_18);
                      if (sVar2 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x9a3,"ref_part_plt_data","dim",1,sVar2);
                        return 1;
                      }
                      if ((long)conn != 0) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x9a4,"ref_part_plt_data","passive variable nonzero plt",0,
                               (long)conn);
                        return 1;
                      }
                    }
                  }
                  sVar2 = fread(&c2n,4,1,pFStack_18);
                  if (sVar2 == 1) {
                    if (c2n == 1) {
                      for (elem = 0; elem < zone_type_local._4_4_; elem = elem + 1) {
                        sVar2 = fread(&c2n,4,1,pFStack_18);
                        if (sVar2 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x9aa,"ref_part_plt_data","dim",1,sVar2);
                          return 1;
                        }
                        if ((long)c2n != -1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x9ab,"ref_part_plt_data","variable sharing not implemented plt",
                                 0xffffffffffffffff,(long)c2n);
                          return 1;
                        }
                      }
                    }
                    sVar2 = fread((void *)((long)&minval + 4),4,1,pFStack_18);
                    if (sVar2 == 1) {
                      if ((long)minval._4_4_ == -1) {
                        for (elem = 0; elem < zone_type_local._4_4_; elem = elem + 1) {
                          sVar2 = fread(&maxval,8,1,pFStack_18);
                          if (sVar2 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x9b2,"ref_part_plt_data","dim",1,sVar2);
                            return 1;
                          }
                          sVar2 = fread(&packing,8,1,pFStack_18);
                          if (sVar2 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x9b3,"ref_part_plt_data","dim",1,sVar2);
                            return 1;
                          }
                        }
                        if (zone_type_local._4_4_ * (int)var_float < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x9b6,"ref_part_plt_data","malloc *soln of REF_DBL negative");
                          file_local._4_4_ = 1;
                        }
                        else {
                          pRVar3 = (REF_DBL *)
                                   malloc((long)(zone_type_local._4_4_ * (int)var_float) << 3);
                          *soln = pRVar3;
                          if (*soln == (REF_DBL *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x9b6,"ref_part_plt_data","malloc *soln of REF_DBL NULL");
                            file_local._4_4_ = 2;
                          }
                          else {
                            if (nelem == 0) {
                              for (elem = 0; elem < zone_type_local._4_4_; elem = elem + 1) {
                                for (node_per = 0; node_per < (int)var_float;
                                    node_per = node_per + 1) {
                                  node = _ref_private_macro_code_rss->value[elem];
                                  if (node == 1) {
                                    sVar2 = fread((void *)((long)&var_double + 4),4,1,pFStack_18);
                                    if (sVar2 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x9bf,"ref_part_plt_data","float",1,sVar2);
                                      return 1;
                                    }
                                    (*soln)[elem + zone_type_local._4_4_ * node_per] =
                                         (double)var_double._4_4_;
                                  }
                                  else {
                                    if (node != 2) {
                                      printf("dataformat = %d\n",(ulong)(uint)node);
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x9c8,"ref_part_plt_data",6,
                                             "implement tecplot plt dataformat read");
                                      return 6;
                                    }
                                    sVar2 = fread(&dataformats,8,1,pFStack_18);
                                    if (sVar2 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x9c3,"ref_part_plt_data","double",1,sVar2);
                                      return 1;
                                    }
                                    (*soln)[elem + zone_type_local._4_4_ * node_per] =
                                         (REF_DBL)dataformats;
                                  }
                                }
                              }
                            }
                            else {
                              for (node_per = 0; node_per < (int)var_float; node_per = node_per + 1)
                              {
                                for (elem = 0; elem < zone_type_local._4_4_; elem = elem + 1) {
                                  node = _ref_private_macro_code_rss->value[elem];
                                  if (node == 1) {
                                    sVar2 = fread((void *)((long)&var_double + 4),4,1,pFStack_18);
                                    if (sVar2 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x9d2,"ref_part_plt_data","float",1,sVar2);
                                      return 1;
                                    }
                                    (*soln)[elem + zone_type_local._4_4_ * node_per] =
                                         (double)var_double._4_4_;
                                  }
                                  else {
                                    if (node != 2) {
                                      printf("dataformat = %d\n",(ulong)(uint)node);
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x9db,"ref_part_plt_data",6,
                                             "implement tecplot plt dataformat read");
                                      return 6;
                                    }
                                    sVar2 = fread(&dataformats,8,1,pFStack_18);
                                    if (sVar2 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x9d6,"ref_part_plt_data","double",1,sVar2);
                                      return 1;
                                    }
                                    (*soln)[elem + zone_type_local._4_4_ * node_per] =
                                         (REF_DBL)dataformats;
                                  }
                                }
                              }
                            }
                            for (passive = 0; passive < local_88; passive = passive + 1) {
                              for (elem = 0; elem < sharing; elem = elem + 1) {
                                sVar2 = fread(&minval,4,1,pFStack_18);
                                if (sVar2 != 1) {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0x9e3,"ref_part_plt_data","dim",1,sVar2);
                                  return 1;
                                }
                              }
                            }
                            ref_list_free(_ref_private_macro_code_rss);
                            file_local._4_4_ = 0;
                          }
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x9af,"ref_part_plt_data","connectivity sharing not implemented plt"
                               ,0xffffffffffffffff,(long)minval._4_4_);
                        file_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x9ae,"ref_part_plt_data","dim",1,sVar2);
                      file_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x9a7,"ref_part_plt_data","dim",1,sVar2);
                    file_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x9a0,"ref_part_plt_data","dim",1,sVar2);
                  file_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                       0x4072b00000000000,dVar4,local_210,0x3df48c1049e0a062,
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x99a,"ref_part_plt_data","start of data header expected");
                file_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x999,"ref_part_plt_data","zonemarker",1,sVar2);
              file_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x97d,"ref_part_plt_data",(ulong)uVar1,"zone elem size");
            file_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x97c,"ref_part_plt_data",(ulong)uVar1,"zone node size");
          file_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x97b,"ref_part_plt_data",(ulong)uVar1,"zone packing");
        file_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x97a,
             "ref_part_plt_data",(ulong)uVar1,"zonetype");
      file_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x978,
           "ref_part_plt_data",(ulong)uVar1,"dataformats");
    file_local._4_4_ = uVar1;
  }
  return file_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_data(
    FILE *file, REF_INT nvar, REF_LIST zone_type, REF_LIST zone_packing,
    REF_LIST zone_nnode, REF_LIST zone_nelem, REF_INT *length, REF_DBL **soln) {
  float zonemarker;
  int dataformat;
  REF_INT i, node, elem, node_per;
  int passive, sharing, conn, c2n;
  double minval, maxval;
  REF_INT zonetype, packing, nnode, nelem;
  float var_float;
  double var_double;
  REF_LIST dataformats = NULL;
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_list_create(&dataformats), "dataformats");

  RSS(ref_list_shift(zone_type, &zonetype), "zonetype");
  RSS(ref_list_shift(zone_packing, &packing), "zone packing");
  RSS(ref_list_shift(zone_nnode, &nnode), "zone node size");
  RSS(ref_list_shift(zone_nelem, &nelem), "zone elem size");

  switch (zonetype) {
    case 1: /* FELINESEG */
      node_per = 2;
      break;
    case 2: /* FETRIANGLE */
      node_per = 3;
      break;
    case 3: /* FEQUADRILATERAL */
      node_per = 4;
      break;
    case 4: /* FETETRAHEDRON */
      node_per = 4;
      break;
    case 5: /* FEBRICK */
      node_per = 8;
      break;
    default:
      printf("zonetype = %d\n", zonetype);
      THROW("unknown tecplot plt zonetype read");
  }
  if (verbose)
    printf("zone type %d node_per %d packing %d nnode %d nelem %d\n", zonetype,
           node_per, packing, nnode, nelem);

  *length = nnode;

  REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  RWDS(299.0, (double)zonemarker, -1.0, "start of data header expected");

  for (i = 0; i < nvar; i++) {
    REIS(1, fread(&dataformat, sizeof(int), 1, file), "dim");
    RSS(ref_list_push(dataformats, dataformat), "save dataformat");
  }
  REIS(1, fread(&passive, sizeof(int), 1, file), "dim");
  if (1 == passive) {
    for (i = 0; i < nvar; i++) {
      REIS(1, fread(&passive, sizeof(int), 1, file), "dim");
      REIS(0, passive, "passive variable nonzero plt");
    }
  }
  REIS(1, fread(&sharing, sizeof(int), 1, file), "dim");
  if (1 == sharing) {
    for (i = 0; i < nvar; i++) {
      REIS(1, fread(&sharing, sizeof(int), 1, file), "dim");
      REIS(-1, sharing, "variable sharing not implemented plt");
    }
  }
  REIS(1, fread(&conn, sizeof(int), 1, file), "dim");
  REIS(-1, conn, "connectivity sharing not implemented plt");

  for (i = 0; i < nvar; i++) {
    REIS(1, fread(&minval, sizeof(double), 1, file), "dim");
    REIS(1, fread(&maxval, sizeof(double), 1, file), "dim");
  }

  ref_malloc(*soln, nvar * nnode, REF_DBL);

  /* Data packing. 0 = Block 1 = Point */
  if (0 == packing) {
    for (i = 0; i < nvar; i++) {
      for (node = 0; node < nnode; node++) {
        dataformat = ref_list_value(dataformats, i);
        switch (dataformat) {
          case 1: /* float */
            REIS(1, fread(&var_float, sizeof(float), 1, file), "float");
            (*soln)[i + nvar * node] = (double)var_float;
            break;
          case 2: /* double */
            REIS(1, fread(&var_double, sizeof(double), 1, file), "double");
            (*soln)[i + nvar * node] = var_double;
            break;
          default:
            printf("dataformat = %d\n", dataformat);
            RSS(REF_IMPLEMENT, "implement tecplot plt dataformat read");
        }
      }
    }
  } else {
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < nvar; i++) {
        dataformat = ref_list_value(dataformats, i);
        switch (dataformat) {
          case 1: /* float */
            REIS(1, fread(&var_float, sizeof(float), 1, file), "float");
            (*soln)[i + nvar * node] = (double)var_float;
            break;
          case 2: /* double */
            REIS(1, fread(&var_double, sizeof(double), 1, file), "double");
            (*soln)[i + nvar * node] = var_double;
            break;
          default:
            printf("dataformat = %d\n", dataformat);
            RSS(REF_IMPLEMENT, "implement tecplot plt dataformat read");
        }
      }
    }
  }

  for (elem = 0; elem < nelem; elem++) {
    for (i = 0; i < node_per; i++) {
      REIS(1, fread(&c2n, sizeof(int), 1, file), "dim");
    }
  }

  ref_list_free(dataformats);

  return REF_SUCCESS;
}